

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

QRegion __thiscall QRegion::intersected(QRegion *this,QRect *r)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QRegion *in_RDX;
  QRegionPrivate *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QRegion *result;
  QRect rect;
  QRegion *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  QRect *r1;
  RegionType t;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined1 in_stack_ffffffffffffffe8 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  r1 = in_RDI;
  bVar2 = isEmptyHelper(*(QRegionPrivate **)(*(long *)in_RSI + 8));
  if ((!bVar2) &&
     (bVar2 = QRect::isEmpty((QRect *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
     , !bVar2)) {
    iVar3 = QRect::right((QRect *)0x6515f7);
    iVar4 = QRect::left((QRect *)0x651605);
    if (iVar4 <= iVar3) {
      iVar3 = QRect::left((QRect *)0x651628);
      iVar4 = QRect::right((QRect *)0x651636);
      if (iVar3 <= iVar4) {
        iVar3 = QRect::bottom((QRect *)0x651655);
        iVar4 = QRect::top((QRect *)0x651663);
        if (iVar4 <= iVar3) {
          iVar4 = QRect::top((QRect *)0x651682);
          iVar5 = QRect::bottom((QRect *)0x651690);
          if (iVar4 <= iVar5) {
            bVar2 = QRegionPrivate::within(in_RSI,r1);
            if (bVar2) {
              QRegion((QRegion *)CONCAT44(iVar3,iVar4),in_stack_ffffffffffffff88);
            }
            else {
              bVar2 = QRegionPrivate::contains(in_RSI,r1);
              if (bVar2) {
                QRegion(in_RDX,(QRect *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8
                                                ),(RegionType)((ulong)in_RSI >> 0x20));
              }
              else if (**(int **)(*(long *)in_RSI + 8) == 1) {
                QRect::normalized();
                t = (RegionType)((ulong)in_RSI >> 0x20);
                qt_rect_intersect_normalized(r1,in_RDI);
                QRegion(in_RDX,(QRect *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8
                                                ),t);
              }
              else {
                *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
                QRegion((QRegion *)CONCAT44(iVar3,iVar4),in_stack_ffffffffffffff88);
                detach((QRegion *)CONCAT44(iVar3,iVar4));
                QRegionPrivate::intersect
                          (in_stack_ffffffffffffffe8._8_8_,in_stack_ffffffffffffffe8._0_8_);
              }
            }
            goto LAB_006517dd;
          }
        }
      }
    }
  }
  QRegion((QRegion *)in_RDI);
LAB_006517dd:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QRegion)(QRegionData *)r1;
}

Assistant:

QRegion QRegion::intersected(const QRect &r) const
{
    if (isEmptyHelper(d->qt_rgn) || r.isEmpty()
        || !EXTENTCHECK(&d->qt_rgn->extents, &r))
        return QRegion();

    /* this is fully contained in r */
    if (d->qt_rgn->within(r))
        return *this;

    /* r is fully contained in this */
    if (d->qt_rgn->contains(r))
        return r;

    if (d->qt_rgn->numRects == 1) {
        const QRect rect = qt_rect_intersect_normalized(d->qt_rgn->extents,
                                                        r.normalized());
        return QRegion(rect);
    }

    QRegion result(*this);
    result.detach();
    result.d->qt_rgn->intersect(r);
    return result;
}